

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void __thiscall ImPlotStyle::ImPlotStyle(ImPlotStyle *this)

{
  ImVec4 *local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImPlotStyle *local_10;
  ImPlotStyle *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->MajorTickLen);
  ImVec2::ImVec2(&this->MinorTickLen);
  ImVec2::ImVec2(&this->MajorTickSize);
  ImVec2::ImVec2(&this->MinorTickSize);
  ImVec2::ImVec2(&this->MajorGridSize);
  ImVec2::ImVec2(&this->MinorGridSize);
  ImVec2::ImVec2(&this->PlotPadding);
  ImVec2::ImVec2(&this->LabelPadding);
  ImVec2::ImVec2(&this->LegendPadding);
  ImVec2::ImVec2(&this->LegendInnerPadding);
  ImVec2::ImVec2(&this->LegendSpacing);
  ImVec2::ImVec2(&this->MousePosPadding);
  ImVec2::ImVec2(&this->AnnotationPadding);
  ImVec2::ImVec2(&this->PlotDefaultSize);
  ImVec2::ImVec2(&this->PlotMinSize);
  local_90 = this->Colors;
  do {
    ImVec4::ImVec4(local_90);
    local_90 = local_90 + 1;
  } while (local_90 != (ImVec4 *)&this->AntiAliasedLines);
  this->LineWeight = 1.0;
  this->Marker = -1;
  this->MarkerSize = 4.0;
  this->MarkerWeight = 1.0;
  this->FillAlpha = 1.0;
  this->ErrorBarSize = 5.0;
  this->ErrorBarWeight = 1.5;
  this->DigitalBitHeight = 8.0;
  this->DigitalBitGap = 4.0;
  this->PlotBorderSize = 1.0;
  this->MinorAlpha = 0.25;
  ImVec2::ImVec2(&local_18,10.0,10.0);
  this->MajorTickLen = local_18;
  ImVec2::ImVec2(&local_20,5.0,5.0);
  this->MinorTickLen = local_20;
  ImVec2::ImVec2(&local_28,1.0,1.0);
  this->MajorTickSize = local_28;
  ImVec2::ImVec2(&local_30,1.0,1.0);
  this->MinorTickSize = local_30;
  ImVec2::ImVec2(&local_38,1.0,1.0);
  this->MajorGridSize = local_38;
  ImVec2::ImVec2(&local_40,1.0,1.0);
  this->MinorGridSize = local_40;
  ImVec2::ImVec2(&local_48,10.0,10.0);
  this->PlotPadding = local_48;
  ImVec2::ImVec2(&local_50,5.0,5.0);
  this->LabelPadding = local_50;
  ImVec2::ImVec2(&local_58,10.0,10.0);
  this->LegendPadding = local_58;
  ImVec2::ImVec2(&local_60,5.0,5.0);
  this->LegendInnerPadding = local_60;
  ImVec2::ImVec2(&local_68,0.0,0.0);
  this->LegendSpacing = local_68;
  ImVec2::ImVec2(&local_70,10.0,10.0);
  this->MousePosPadding = local_70;
  ImVec2::ImVec2(&local_78,2.0,2.0);
  this->AnnotationPadding = local_78;
  ImVec2::ImVec2(&local_80,400.0,300.0);
  this->PlotDefaultSize = local_80;
  ImVec2::ImVec2(&local_88,300.0,225.0);
  this->PlotMinSize = local_88;
  ImPlot::StyleColorsAuto(this);
  this->AntiAliasedLines = false;
  this->UseLocalTime = false;
  this->Use24HourClock = false;
  this->UseISO8601 = false;
  return;
}

Assistant:

ImPlotStyle::ImPlotStyle() {

    LineWeight         = 1;
    Marker             = ImPlotMarker_None;
    MarkerSize         = 4;
    MarkerWeight       = 1;
    FillAlpha          = 1;
    ErrorBarSize       = 5;
    ErrorBarWeight     = 1.5f;
    DigitalBitHeight   = 8;
    DigitalBitGap      = 4;

    PlotBorderSize     = 1;
    MinorAlpha         = 0.25f;
    MajorTickLen       = ImVec2(10,10);
    MinorTickLen       = ImVec2(5,5);
    MajorTickSize      = ImVec2(1,1);
    MinorTickSize      = ImVec2(1,1);
    MajorGridSize      = ImVec2(1,1);
    MinorGridSize      = ImVec2(1,1);
    PlotPadding        = ImVec2(10,10);
    LabelPadding       = ImVec2(5,5);
    LegendPadding      = ImVec2(10,10);
    LegendInnerPadding = ImVec2(5,5);
    LegendSpacing      = ImVec2(0,0);
    MousePosPadding    = ImVec2(10,10);
    AnnotationPadding  = ImVec2(2,2);
    PlotDefaultSize    = ImVec2(400,300);
    PlotMinSize        = ImVec2(300,225);

    ImPlot::StyleColorsAuto(this);

    AntiAliasedLines = false;
    UseLocalTime     = false;
    Use24HourClock   = false;
    UseISO8601       = false;
}